

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O0

cmValue __thiscall
cmConditionEvaluator::GetDefinitionIfUnquoted
          (cmConditionEvaluator *this,cmExpandedCommandArgument *argument)

{
  cmMakefile *pcVar1;
  bool bVar2;
  string *psVar3;
  cmListFileContext *context;
  ostream *poVar4;
  cmake *this_00;
  PolicyID id;
  string local_1e8;
  string local_1b8;
  undefined1 local_198 [8];
  ostringstream e;
  cmExpandedCommandArgument *argument_local;
  cmConditionEvaluator *this_local;
  cmValue def;
  
  if (((this->Policy54Status == WARN) || (this->Policy54Status == OLD)) ||
     (bVar2 = cmExpandedCommandArgument::WasQuoted(argument), !bVar2)) {
    pcVar1 = this->Makefile;
    psVar3 = cmExpandedCommandArgument::GetValue_abi_cxx11_(argument);
    this_local = (cmConditionEvaluator *)cmMakefile::GetDefinition(pcVar1,psVar3);
    bVar2 = cmValue::operator_cast_to_bool((cmValue *)&this_local);
    if (((bVar2) && (bVar2 = cmExpandedCommandArgument::WasQuoted(argument), bVar2)) &&
       (this->Policy54Status == WARN)) {
      pcVar1 = this->Makefile;
      context = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                          (&(this->Backtrace).
                            super_cmConstStack<cmListFileContext,_cmListFileBacktrace>);
      bVar2 = cmMakefile::HasCMP0054AlreadyBeenReported(pcVar1,context);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1b8,(cmPolicies *)0x36,id);
        poVar4 = std::operator<<((ostream *)local_198,(string *)&local_1b8);
        poVar4 = std::operator<<(poVar4,"\nQuoted variables like \"");
        psVar3 = cmExpandedCommandArgument::GetValue_abi_cxx11_(argument);
        poVar4 = std::operator<<(poVar4,(string *)psVar3);
        std::operator<<(poVar4,
                        "\" will no longer be dereferenced when the policy is set to NEW.  Since the policy is not set the OLD behavior will be used."
                       );
        std::__cxx11::string::~string((string *)&local_1b8);
        this_00 = cmMakefile::GetCMakeInstance(this->Makefile);
        std::__cxx11::ostringstream::str();
        cmake::IssueMessage(this_00,AUTHOR_WARNING,&local_1e8,&this->Backtrace);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
      }
    }
  }
  else {
    cmValue::cmValue((cmValue *)&this_local,(nullptr_t)0x0);
  }
  return (cmValue)(string *)this_local;
}

Assistant:

cmValue cmConditionEvaluator::GetDefinitionIfUnquoted(
  cmExpandedCommandArgument const& argument) const
{
  if ((this->Policy54Status != cmPolicies::WARN &&
       this->Policy54Status != cmPolicies::OLD) &&
      argument.WasQuoted()) {
    return nullptr;
  }

  cmValue def = this->Makefile.GetDefinition(argument.GetValue());

  if (def && argument.WasQuoted() &&
      this->Policy54Status == cmPolicies::WARN) {
    if (!this->Makefile.HasCMP0054AlreadyBeenReported(this->Backtrace.Top())) {
      std::ostringstream e;
      // clang-format off
      e << (cmPolicies::GetPolicyWarning(cmPolicies::CMP0054))
        << "\n"
           "Quoted variables like \"" << argument.GetValue() << "\" "
           "will no longer be dereferenced when the policy is set to NEW.  "
           "Since the policy is not set the OLD behavior will be used.";
      // clang-format on

      this->Makefile.GetCMakeInstance()->IssueMessage(
        MessageType::AUTHOR_WARNING, e.str(), this->Backtrace);
    }
  }

  return def;
}